

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O2

void __thiscall tinyusdz::usdc::USDCReader::Impl::PushWarn(Impl *this,string *s)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ::std::operator+(&local_30,s,&this->_warn);
  ::std::__cxx11::string::operator=((string *)&this->_warn,(string *)&local_30);
  ::std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void PushWarn(const std::string &s) { _warn = s + _warn; }